

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.hpp
# Opt level: O2

void __thiscall
cs_function_invoker_impl::function_invoker<void(cs::numeric)>::operator()
          (function_invoker<void(cs::numeric)> *this,int *args)

{
  bool bVar1;
  type_info *ptVar2;
  callable *pcVar3;
  object_method *poVar4;
  runtime_error *this_00;
  long lVar5;
  initializer_list<cs_impl::any> __l;
  initializer_list<cs_impl::any> __l_00;
  allocator_type local_69;
  undefined1 local_68 [16];
  vector args_1;
  anon_union_16_2_310e9938_for_data local_38;
  undefined1 local_28;
  
  local_38._int = (numeric_integer)*args;
  local_28 = 1;
  ptVar2 = cs_impl::any::type((any *)this);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::callable::typeinfo);
  if (bVar1) {
    cs_impl::any::any<cs::numeric>((any *)local_68,(numeric *)&local_38);
    __l._M_len = 1;
    __l._M_array = (iterator)local_68;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&args_1,__l,&local_69);
    cs_impl::any::recycle((any *)local_68);
    pcVar3 = cs_impl::any::const_val<cs::callable>((any *)this);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)local_68,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar3);
  }
  else {
    ptVar2 = cs_impl::any::type((any *)this);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::object_method::typeinfo);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&args_1,"Invoke non-callable object.",(allocator *)local_68);
      cs::runtime_error::runtime_error(this_00,(string *)&args_1);
      __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    poVar4 = cs_impl::any::const_val<cs::object_method>((any *)this);
    local_68._0_8_ = (poVar4->object).mDat;
    if ((proxy *)local_68._0_8_ != (proxy *)0x0) {
      ((proxy *)local_68._0_8_)->refcount = ((proxy *)local_68._0_8_)->refcount + 1;
    }
    cs_impl::any::any<cs::numeric>((any *)(local_68 + 8),(numeric *)&local_38);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_68;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&args_1,__l_00,&local_69);
    lVar5 = 8;
    do {
      cs_impl::any::recycle((any *)(local_68 + lVar5));
      lVar5 = lVar5 + -8;
    } while (lVar5 != -8);
    pcVar3 = cs_impl::any::const_val<cs::callable>(&poVar4->callable);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)local_68,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar3);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&args_1);
  cs_impl::any::recycle((any *)local_68);
  return;
}

Assistant:

RetT operator()(ElementT &&...args) const
		{
			return convert_helper<RetT>::get_val(cs::invoke(m_func, cs_impl::type_convertor<ElementT, ArgsT>::convert(
			        std::forward<ElementT>(args))...));
		}